

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::SIVTest
          (LoopDependenceAnalysis *this,
          pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *subscript_pair,
          DistanceVector *distance_vector)

{
  SENode *node;
  SENode *node_00;
  SERecurrentNode *pSVar1;
  SERecurrentNode *pSVar2;
  long *plVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  DistanceEntry *distance_entry;
  int64_t iVar7;
  int64_t iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SENode *pSVar9;
  char *pcVar10;
  SENode *pSVar11;
  char *pcVar12;
  _Alloc_hider _Var13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  string *debug_msg;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  destination_recurrent_nodes;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  source_recurrent_nodes;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  local_1a0;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  local_188;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  distance_entry = GetDistanceEntryForSubscriptPair(this,subscript_pair,distance_vector);
  if (distance_entry == (DistanceEntry *)0x0) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,
               "SIVTest could not find a DistanceEntry for subscript_pair. Exiting","");
    PrintDebug(this,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  node = subscript_pair->first;
  node_00 = subscript_pair->second;
  iVar7 = CountInductionVariables(this,node);
  iVar8 = CountInductionVariables(this,node_00);
  if (iVar7 == 0) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Found source has no induction variable.","");
    PrintDebug(this,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    iVar5 = (*node_00->_vptr_SENode[6])(node_00);
    iVar6 = (*node_00->_vptr_SENode[6])(node_00);
    bVar4 = WeakZeroSourceSIVTest
                      (this,node,(SERecurrentNode *)CONCAT44(extraout_var,iVar5),
                       *(SENode **)(CONCAT44(extraout_var_00,iVar6) + 0x30),distance_entry);
    if (!bVar4) goto LAB_006075c9;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"Proved independence with WeakZeroSourceSIVTest.","");
    PrintDebug(this,&local_d0);
    _Var13._M_p = local_d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == &local_d0.field_2) goto LAB_0060769c;
LAB_00607694:
    operator_delete(_Var13._M_p,local_d0.field_2._M_allocated_capacity + 1);
LAB_0060769c:
    distance_entry->dependence_information = DIRECTION;
    distance_entry->direction = NONE;
    return true;
  }
LAB_006075c9:
  if (iVar8 == 0) {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"Found destination has no induction variable.","");
    PrintDebug(this,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    iVar5 = (*node->_vptr_SENode[6])(node);
    iVar6 = (*node->_vptr_SENode[6])(node);
    bVar4 = WeakZeroDestinationSIVTest
                      (this,(SERecurrentNode *)CONCAT44(extraout_var_01,iVar5),node_00,
                       *(SENode **)(CONCAT44(extraout_var_02,iVar6) + 0x30),distance_entry);
    if (bVar4) {
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,"Proved independence with WeakZeroDestinationSIVTest.","");
      PrintDebug(this,&local_110);
      local_d0.field_2._M_allocated_capacity = local_110.field_2._M_allocated_capacity;
      _Var13._M_p = local_110._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p == &local_110.field_2) goto LAB_0060769c;
      goto LAB_00607694;
    }
  }
  SENode::CollectRecurrentNodes(&local_188,node);
  SENode::CollectRecurrentNodes(&local_1a0,node_00);
  if ((long)local_188.
            super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_188.
            super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start != 8) goto LAB_006078cd;
  if ((long)local_1a0.
            super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_1a0.
            super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start != 8) {
    bVar4 = false;
    goto LAB_006078d4;
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,"Found source and destination have 1 induction variable.","");
  PrintDebug(this,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  pSVar1 = *local_188.
            super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = *local_1a0.
            super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar11 = pSVar1->coefficient_;
  pSVar9 = pSVar2->coefficient_;
  if (pSVar11 == pSVar9) {
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"Found source and destination share coefficient.","");
    PrintDebug(this,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    bVar4 = StrongSIVTest(this,node,node_00,pSVar1->coefficient_,distance_entry);
    if (!bVar4) {
      pSVar11 = pSVar1->coefficient_;
      pSVar9 = pSVar2->coefficient_;
      goto LAB_00607800;
    }
    paVar14 = &local_50.field_2;
    pcVar12 = "Proved independence with StrongSIVTest";
    pcVar10 = "";
    debug_msg = &local_50;
    local_50._M_dataplus._M_p = (pointer)paVar14;
LAB_00607897:
    std::__cxx11::string::_M_construct<char_const*>((string *)debug_msg,pcVar12,pcVar10);
    PrintDebug(this,debug_msg);
    plVar3 = (long *)(debug_msg->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar3 != paVar14) {
      operator_delete(plVar3,paVar14->_M_allocated_capacity + 1);
    }
    distance_entry->dependence_information = DIRECTION;
    distance_entry->direction = NONE;
    bVar4 = true;
  }
  else {
LAB_00607800:
    pSVar9 = ScalarEvolutionAnalysis::CreateNegation(&this->scalar_evolution_,pSVar9);
    if (pSVar11 == pSVar9) {
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_150,"Found source coefficient = -destination coefficient.","");
      PrintDebug(this,&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      bVar4 = WeakCrossingSIVTest(this,node,node_00,pSVar1->coefficient_,distance_entry);
      if (bVar4) {
        paVar14 = &local_70.field_2;
        pcVar12 = "Proved independence with WeakCrossingSIVTest";
        pcVar10 = "";
        debug_msg = &local_70;
        local_70._M_dataplus._M_p = (pointer)paVar14;
        goto LAB_00607897;
      }
    }
LAB_006078cd:
    bVar4 = false;
  }
LAB_006078d4:
  if (local_1a0.
      super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.
                    super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a0.
                          super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.
                          super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_188.
      super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.
                    super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_188.
                          super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.
                          super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool LoopDependenceAnalysis::SIVTest(
    const std::pair<SENode*, SENode*>& subscript_pair,
    DistanceVector* distance_vector) {
  DistanceEntry* distance_entry =
      GetDistanceEntryForSubscriptPair(subscript_pair, distance_vector);
  if (!distance_entry) {
    PrintDebug(
        "SIVTest could not find a DistanceEntry for subscript_pair. Exiting");
  }

  SENode* source_node = std::get<0>(subscript_pair);
  SENode* destination_node = std::get<1>(subscript_pair);

  int64_t source_induction_count = CountInductionVariables(source_node);
  int64_t destination_induction_count =
      CountInductionVariables(destination_node);

  // If the source node has no induction variables we can apply a
  // WeakZeroSrcTest.
  if (source_induction_count == 0) {
    PrintDebug("Found source has no induction variable.");
    if (WeakZeroSourceSIVTest(
            source_node, destination_node->AsSERecurrentNode(),
            destination_node->AsSERecurrentNode()->GetCoefficient(),
            distance_entry)) {
      PrintDebug("Proved independence with WeakZeroSourceSIVTest.");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::DIRECTION;
      distance_entry->direction = DistanceEntry::Directions::NONE;
      return true;
    }
  }

  // If the destination has no induction variables we can apply a
  // WeakZeroDestTest.
  if (destination_induction_count == 0) {
    PrintDebug("Found destination has no induction variable.");
    if (WeakZeroDestinationSIVTest(
            source_node->AsSERecurrentNode(), destination_node,
            source_node->AsSERecurrentNode()->GetCoefficient(),
            distance_entry)) {
      PrintDebug("Proved independence with WeakZeroDestinationSIVTest.");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::DIRECTION;
      distance_entry->direction = DistanceEntry::Directions::NONE;
      return true;
    }
  }

  // We now need to collect the SERecurrentExpr nodes from source and
  // destination. We do not handle cases where source or destination have
  // multiple SERecurrentExpr nodes.
  std::vector<SERecurrentNode*> source_recurrent_nodes =
      source_node->CollectRecurrentNodes();
  std::vector<SERecurrentNode*> destination_recurrent_nodes =
      destination_node->CollectRecurrentNodes();

  if (source_recurrent_nodes.size() == 1 &&
      destination_recurrent_nodes.size() == 1) {
    PrintDebug("Found source and destination have 1 induction variable.");
    SERecurrentNode* source_recurrent_expr = *source_recurrent_nodes.begin();
    SERecurrentNode* destination_recurrent_expr =
        *destination_recurrent_nodes.begin();

    // If the coefficients are identical we can apply a StrongSIVTest.
    if (source_recurrent_expr->GetCoefficient() ==
        destination_recurrent_expr->GetCoefficient()) {
      PrintDebug("Found source and destination share coefficient.");
      if (StrongSIVTest(source_node, destination_node,
                        source_recurrent_expr->GetCoefficient(),
                        distance_entry)) {
        PrintDebug("Proved independence with StrongSIVTest");
        distance_entry->dependence_information =
            DistanceEntry::DependenceInformation::DIRECTION;
        distance_entry->direction = DistanceEntry::Directions::NONE;
        return true;
      }
    }

    // If the coefficients are of equal magnitude and opposite sign we can
    // apply a WeakCrossingSIVTest.
    if (source_recurrent_expr->GetCoefficient() ==
        scalar_evolution_.CreateNegation(
            destination_recurrent_expr->GetCoefficient())) {
      PrintDebug("Found source coefficient = -destination coefficient.");
      if (WeakCrossingSIVTest(source_node, destination_node,
                              source_recurrent_expr->GetCoefficient(),
                              distance_entry)) {
        PrintDebug("Proved independence with WeakCrossingSIVTest");
        distance_entry->dependence_information =
            DistanceEntry::DependenceInformation::DIRECTION;
        distance_entry->direction = DistanceEntry::Directions::NONE;
        return true;
      }
    }
  }

  return false;
}